

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O3

void Abc_NtkDontCareFree(Odc_Man_t *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Vec_Int_t *__ptr;
  int *__ptr_00;
  int level;
  
  if (p->fVerbose != 0) {
    printf("Wins = %5d. Empty = %5d. SimsEmpty = %5d. QuantOver = %5d. WinsFinish = %5d.\n",
           (ulong)(uint)p->nWins,(ulong)(uint)p->nWinsEmpty,(ulong)(uint)p->nSimsEmpty,
           (ulong)(uint)p->nQuantsOver,(ulong)(uint)p->nWinsFinish);
    uVar1 = p->nWinsFinish;
    uVar2 = p->nTotalDcs;
    printf("Ave DCs per window = %6.2f %%. Ave DCs per finished window = %6.2f %%.\n",
           (double)(int)uVar2 / (double)p->nWins,(double)(int)uVar2 / (double)(int)uVar1);
    level = 0xa5c549;
    puts("Runtime stats of the ODC manager:");
    Abc_Print(level,"%s =","Cleaning    ");
    Abc_Print(level,"%9.2f sec\n",(double)p->timeClean / 1000000.0);
    Abc_Print(level,"%s =","Windowing   ");
    Abc_Print(level,"%9.2f sec\n",(double)p->timeWin / 1000000.0);
    Abc_Print(level,"%s =","Miter       ");
    Abc_Print(level,"%9.2f sec\n",(double)p->timeMiter / 1000000.0);
    Abc_Print(level,"%s =","Simulation  ");
    Abc_Print(level,"%9.2f sec\n",(double)p->timeSim / 1000000.0);
    Abc_Print(level,"%s =","Quantifying ");
    Abc_Print(level,"%9.2f sec\n",(double)p->timeQuant / 1000000.0);
    Abc_Print(level,"%s =","Truth table ");
    Abc_Print(level,"%9.2f sec\n",(double)p->timeTruth / 1000000.0);
    Abc_Print(level,"%s =","TOTAL       ");
    Abc_Print(level,"%9.2f sec\n",(double)p->timeTotal / 1000000.0);
    Abc_Print(level,"%s =","Aborted     ");
    Abc_Print(level,"%9.2f sec\n",(double)p->timeAbort / 1000000.0);
  }
  pVVar3 = p->vRoots;
  ppvVar4 = pVVar3->pArray;
  if (ppvVar4 != (void **)0x0) {
    free(ppvVar4);
  }
  free(pVVar3);
  pVVar3 = p->vBranches;
  ppvVar4 = pVVar3->pArray;
  if (ppvVar4 != (void **)0x0) {
    free(ppvVar4);
  }
  free(pVVar3);
  pVVar3 = p->vTruths;
  ppvVar4 = pVVar3->pArray;
  if (ppvVar4 != (void **)0x0) {
    free(ppvVar4);
  }
  free(pVVar3);
  pVVar3 = p->vTruthsElem;
  ppvVar4 = pVVar3->pArray;
  if (ppvVar4 != (void **)0x0) {
    free(ppvVar4);
  }
  free(pVVar3);
  __ptr = p->vUsedSpots;
  __ptr_00 = __ptr->pArray;
  if (__ptr_00 != (int *)0x0) {
    free(__ptr_00);
  }
  free(__ptr);
  if (p->pObjs != (Odc_Obj_t *)0x0) {
    free(p->pObjs);
    p->pObjs = (Odc_Obj_t *)0x0;
  }
  if (p->pTable != (Odc_Lit_t *)0x0) {
    free(p->pTable);
  }
  free(p);
  return;
}

Assistant:

void Abc_NtkDontCareFree( Odc_Man_t * p )
{
    if ( p->fVerbose )
    {
        printf( "Wins = %5d. Empty = %5d. SimsEmpty = %5d. QuantOver = %5d. WinsFinish = %5d.\n", 
            p->nWins, p->nWinsEmpty, p->nSimsEmpty, p->nQuantsOver, p->nWinsFinish );
        printf( "Ave DCs per window = %6.2f %%. Ave DCs per finished window = %6.2f %%.\n", 
            1.0*p->nTotalDcs/p->nWins, 1.0*p->nTotalDcs/p->nWinsFinish );
        printf( "Runtime stats of the ODC manager:\n" );
        ABC_PRT( "Cleaning    ", p->timeClean );
        ABC_PRT( "Windowing   ", p->timeWin   );
        ABC_PRT( "Miter       ", p->timeMiter );
        ABC_PRT( "Simulation  ", p->timeSim   );
        ABC_PRT( "Quantifying ", p->timeQuant );
        ABC_PRT( "Truth table ", p->timeTruth );
        ABC_PRT( "TOTAL       ", p->timeTotal );
        ABC_PRT( "Aborted     ", p->timeAbort );
    }
    Vec_PtrFree( p->vRoots );
    Vec_PtrFree( p->vBranches );
    Vec_PtrFree( p->vTruths );
    Vec_PtrFree( p->vTruthsElem );
    Vec_IntFree( p->vUsedSpots );
    ABC_FREE( p->pObjs );
    ABC_FREE( p->pTable );
    ABC_FREE( p );
}